

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O1

UniValue * __thiscall
NetinfoRequestHandler::ProcessReply
          (UniValue *__return_storage_ptr__,NetinfoRequestHandler *this,UniValue *batch_in)

{
  size_t *psVar1;
  unsigned_short *puVar2;
  VType VVar3;
  long lVar4;
  pointer pcVar5;
  pointer pPVar6;
  UniValue result_00;
  UniValue error;
  optional<UniValue> id;
  char *pcVar7;
  pointer pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  UniValue *pUVar13;
  UniValue *pUVar14;
  long lVar15;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar16;
  long lVar17;
  string *psVar18;
  long lVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  UniValue *this_00;
  runtime_error *this_01;
  ulong uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  char (*args) [2];
  char *pcVar23;
  byte bVar24;
  size_t i;
  pointer pPVar25;
  pointer pcVar26;
  pointer pUVar27;
  size_t i_1;
  char *__end_7;
  const_iterator __end2;
  array<const_char_*,_7UL> *paVar28;
  pointer pUVar29;
  char *__end;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  char **args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  NetinfoRequestHandler *pNVar31;
  uint8_t *puVar32;
  uint8_t *args_00;
  pointer pUVar33;
  uint8_t *args_01;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa11;
  pointer in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa24;
  double in_stack_fffffffffffffa30;
  double in_stack_fffffffffffffa38;
  vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
  *in_stack_fffffffffffffa40;
  long in_stack_fffffffffffffa48;
  long in_stack_fffffffffffffa50;
  long in_stack_fffffffffffffa58;
  array<std::array<unsigned_short,_8UL>,_3UL> *in_stack_fffffffffffffa60;
  size_t in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  undefined7 uStack_568;
  undefined1 local_561 [9];
  vector<UniValue,_std::allocator<UniValue>_> batch;
  _Optional_payload_base<UniValue> local_540;
  VType local_4e0;
  long *local_4d8 [2];
  long local_4c8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  vector<UniValue,_std::allocator<UniValue>_> local_4a0;
  UniValue local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  long *local_410 [2];
  long local_400 [2];
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  int peer_id;
  undefined4 uStack_36c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  int64_t addr_rate_limited;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  int64_t addr_processed;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  string result;
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  double local_250;
  double local_248;
  int64_t local_240;
  int64_t local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  int local_210;
  int local_20c;
  int local_208;
  bool local_204;
  bool local_203;
  bool local_202;
  bool local_201;
  bool local_200;
  string local_1f8;
  string local_1d8;
  array<const_char_*,_3UL> rows;
  vector<signed_char,_std::allocator<signed_char>_> reachable_networks;
  string age;
  string addr;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string conn_type;
  string local_78;
  string network;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  JSONRPCProcessBatchReply(&batch,batch_in);
  pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"error","");
  pUVar13 = UniValue::operator[](pUVar27,&result);
  VVar3 = pUVar13->typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
  }
  pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (VVar3 == VNULL) {
    result._M_dataplus._M_p = (pointer)&result.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"error","");
    pUVar13 = UniValue::operator[](pUVar27 + 1,&result);
    VVar3 = pUVar13->typ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
    }
    pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (VVar3 == VNULL) {
      result._M_dataplus._M_p = (pointer)&result.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"result","");
      pUVar13 = UniValue::operator[](pUVar27 + 1,&result);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      result._M_dataplus._M_p = (pointer)&result.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"version","");
      pUVar14 = UniValue::operator[](pUVar13,&result);
      iVar12 = UniValue::getInt<int>(pUVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      if (iVar12 < 0x333ec) goto LAB_00130243;
      lVar15 = std::chrono::_V2::system_clock::now();
      pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start;
      result._M_dataplus._M_p = (pointer)&result.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"result","");
      pUVar14 = UniValue::operator[](pUVar27,&result);
      pvVar16 = UniValue::getValues(pUVar14);
      lVar17 = lVar15 / 1000000000 + (lVar15 >> 0x3f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      lVar17 = lVar17 - (lVar15 >> 0x3f);
      pUVar27 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar29 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pUVar27 != pUVar29) {
        in_stack_fffffffffffffa60 = &this->m_counts;
        in_stack_fffffffffffffa40 = &this->m_peers;
        in_stack_fffffffffffff9f0 = &local_2e0;
        in_stack_fffffffffffffa08 = &local_2c0;
        do {
          result._M_dataplus._M_p = (pointer)&result.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&result,"network","");
          pUVar14 = UniValue::operator[](pUVar27,&result);
          psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
          pcVar5 = (psVar18->_M_dataplus)._M_p;
          network._M_dataplus._M_p = (pointer)&network.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&network,pcVar5,pcVar5 + psVar18->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != &result.field_2) {
            operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
          }
          paVar28 = &NETWORKS;
          lVar15 = 0;
          do {
            iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&network,paVar28->_M_elems[0]);
            if (iVar12 == 0) goto LAB_0012d8df;
            lVar15 = lVar15 + 1;
            paVar28 = (array<const_char_*,_7UL> *)((long)paVar28 + 8);
          } while (lVar15 != 7);
          lVar15 = 0xff;
LAB_0012d8df:
          bVar24 = (byte)lVar15;
          if (bVar24 != 0xff) {
            result._M_dataplus._M_p = (pointer)&result.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&result,"inbound","");
            pUVar14 = UniValue::operator[](pUVar27,&result);
            bVar9 = UniValue::get_bool(pUVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)result._M_dataplus._M_p != &result.field_2) {
              operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
            }
            result._M_dataplus._M_p = (pointer)&result.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&result,"relaytxes","");
            pUVar14 = UniValue::operator[](pUVar27,&result);
            VVar3 = pUVar14->typ;
            if (VVar3 == VNULL) {
              in_stack_fffffffffffffa00 = true;
            }
            else {
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"relaytxes","");
              pUVar14 = UniValue::operator[](pUVar27,&local_78);
              in_stack_fffffffffffffa00 = UniValue::get_bool(pUVar14);
            }
            if ((VVar3 != VNULL) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2)) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)result._M_dataplus._M_p != &result.field_2) {
              operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
            }
            result._M_dataplus._M_p = (pointer)&result.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&result,"connection_type","");
            pUVar14 = UniValue::operator[](pUVar27,&result);
            psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
            conn_type._M_dataplus._M_p = (pointer)&conn_type.field_2;
            pcVar5 = (psVar18->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&conn_type,pcVar5,pcVar5 + psVar18->_M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)result._M_dataplus._M_p != &result.field_2) {
              operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
            }
            in_stack_fffffffffffffa18 = (pointer)(long)(char)bVar24;
            if (7 < bVar24) goto LAB_00130219;
            in_stack_fffffffffffffa10 = !bVar9;
            puVar2 = in_stack_fffffffffffffa60->_M_elems[(byte)in_stack_fffffffffffffa10]._M_elems +
                     (long)in_stack_fffffffffffffa18;
            *puVar2 = *puVar2 + 1;
            puVar2 = in_stack_fffffffffffffa60->_M_elems[(byte)in_stack_fffffffffffffa10]._M_elems +
                     7;
            *puVar2 = *puVar2 + 1;
            puVar2 = (this->m_counts)._M_elems[2]._M_elems + (long)in_stack_fffffffffffffa18;
            *puVar2 = *puVar2 + 1;
            puVar2 = (this->m_counts)._M_elems[2]._M_elems + 7;
            *puVar2 = *puVar2 + 1;
            iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&conn_type,"block-relay-only");
            if (iVar12 == 0) {
              this->m_block_relay_peers_count = this->m_block_relay_peers_count + '\x01';
            }
            iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&conn_type,"manual");
            if (iVar12 == 0) {
              this->m_manual_peers_count = this->m_manual_peers_count + '\x01';
            }
            if ((byte)(this->m_details_level - 1) < 4) {
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"id","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              iVar12 = UniValue::getInt<int>(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              peer_id = iVar12;
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"mapped_as","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              if (pUVar14->typ == VNULL) {
                in_stack_fffffffffffff9ec = 0;
              }
              else {
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mapped_as","");
                pUVar14 = UniValue::operator[](pUVar27,&local_b8);
                in_stack_fffffffffffff9ec = UniValue::getInt<int>(pUVar14);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"version","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              in_stack_fffffffffffffa24 = UniValue::getInt<int>(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"addr_processed","")
              ;
              pUVar14 = UniValue::operator[](pUVar27,&result);
              if (pUVar14->typ == VNULL) {
                lVar15 = 0;
              }
              else {
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d8,"addr_processed","");
                pUVar14 = UniValue::operator[](pUVar27,&local_d8);
                lVar15 = UniValue::getInt<long>(pUVar14);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              addr_processed = lVar15;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&result,"addr_rate_limited","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              if (pUVar14->typ == VNULL) {
                lVar15 = 0;
              }
              else {
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f8,"addr_rate_limited","");
                pUVar14 = UniValue::operator[](pUVar27,&local_f8);
                lVar15 = UniValue::getInt<long>(pUVar14);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              addr_rate_limited = lVar15;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"conntime","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              lVar15 = UniValue::getInt<long>(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"last_block","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              lVar19 = UniValue::getInt<long>(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"lastrecv","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              in_stack_fffffffffffffa48 = UniValue::getInt<long>(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"lastsend","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              in_stack_fffffffffffffa58 = UniValue::getInt<long>(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&result,"last_transaction","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              in_stack_fffffffffffffa50 = UniValue::getInt<long>(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"minping","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              in_stack_fffffffffffffa38 = -1.0;
              if (pUVar14->typ != VNULL) {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"minping","");
                pUVar14 = UniValue::operator[](pUVar27,&local_118);
                in_stack_fffffffffffffa38 = UniValue::get_real(pUVar14);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"pingtime","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              VVar3 = pUVar14->typ;
              in_stack_fffffffffffffa30 = -1.0;
              if (VVar3 != VNULL) {
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"pingtime","");
                pUVar14 = UniValue::operator[](pUVar27,&local_138);
                in_stack_fffffffffffffa30 = UniValue::get_real(pUVar14);
              }
              if ((VVar3 != VNULL) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2)) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"addr","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
              addr._M_dataplus._M_p = (pointer)&addr.field_2;
              pcVar5 = (psVar18->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&addr,pcVar5,pcVar5 + psVar18->_M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              if (lVar15 == 0) {
                age._M_dataplus._M_p = (pointer)&age.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&age,"");
              }
              else {
                result._M_dataplus._M_p = (pointer)((lVar17 - lVar15) / 0x3c);
                util::ToString<long>(&age,(long *)&result);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"subver","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
              reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)&reachable_networks.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              pcVar5 = (psVar18->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&reachable_networks,pcVar5,pcVar5 + psVar18->_M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&result,"transport_protocol_type","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              if (pUVar14->typ == VNULL) {
                rows._M_elems[0] = (char *)(rows._M_elems + 2);
                std::__cxx11::string::_M_construct<char_const*>((string *)&rows,"v1","");
              }
              else {
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d8,"transport_protocol_type","");
                pUVar14 = UniValue::operator[](pUVar27,&local_1d8);
                psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
                rows._M_elems[0] = (char *)(rows._M_elems + 2);
                pcVar5 = (psVar18->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&rows,pcVar5,pcVar5 + psVar18->_M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&result,"addr_relay_enabled","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              if (pUVar14->typ == VNULL) {
                bVar9 = false;
              }
              else {
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1f8,"addr_relay_enabled","");
                pUVar14 = UniValue::operator[](pUVar27,&local_1f8);
                bVar9 = UniValue::get_bool(pUVar14);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"bip152_hb_from","")
              ;
              pUVar14 = UniValue::operator[](pUVar27,&result);
              bVar10 = UniValue::get_bool(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"bip152_hb_to","");
              pUVar14 = UniValue::operator[](pUVar27,&result);
              bVar11 = UniValue::get_bool(pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              result._M_dataplus._M_p = (pointer)&result.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&result,addr._M_dataplus._M_p,
                         addr._M_dataplus._M_p + addr._M_string_length);
              local_2f0._M_p = (pointer)&local_2e0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2f0,
                         reachable_networks.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         reachable_networks.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         (long)reachable_networks.
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                               .super__Vector_impl_data._M_start);
              local_2d0._M_p = (pointer)&local_2c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d0,conn_type._M_dataplus._M_p,
                         conn_type._M_dataplus._M_p + conn_type._M_string_length);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2b0,
                         NETWORK_SHORT_NAMES._M_elems[(long)in_stack_fffffffffffffa18],
                         (allocator<char> *)&local_390);
              local_290._M_p = (pointer)&local_280;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_290,age._M_dataplus._M_p,
                         age._M_dataplus._M_p + age._M_string_length);
              local_270._M_p = (pointer)&local_260;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_270,rows._M_elems[0],
                         rows._M_elems[1] + (long)rows._M_elems[0]);
              local_240 = addr_processed;
              local_238 = addr_rate_limited;
              local_210 = peer_id;
              local_250 = in_stack_fffffffffffffa38;
              local_248 = in_stack_fffffffffffffa30;
              local_230 = lVar19;
              local_228 = in_stack_fffffffffffffa48;
              local_220 = in_stack_fffffffffffffa58;
              local_218 = in_stack_fffffffffffffa50;
              local_20c = in_stack_fffffffffffff9ec;
              local_208 = in_stack_fffffffffffffa24;
              local_204 = bVar9;
              local_203 = bVar10;
              local_202 = bVar11;
              local_201 = (bool)in_stack_fffffffffffffa10;
              local_200 = (bool)in_stack_fffffffffffffa00;
              std::vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
              ::emplace_back<NetinfoRequestHandler::Peer>(in_stack_fffffffffffffa40,(Peer *)&result)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_p != &local_260) {
                operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_p != &local_280) {
                operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_p != &local_2a0) {
                operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_p != &local_2c0) {
                operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_p != &local_2e0) {
                operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              uVar21 = addr._M_string_length + 1;
              if (addr._M_string_length + 1 <= this->m_max_addr_length) {
                uVar21 = this->m_max_addr_length;
              }
              this->m_max_addr_length = uVar21;
              pNVar31 = this;
              util::ToString<long>(&result,&addr_processed);
              uVar21 = this->m_max_addr_processed_length;
              if (this->m_max_addr_processed_length < result._M_string_length) {
                uVar21 = result._M_string_length;
              }
              this->m_max_addr_processed_length = uVar21;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              util::ToString<long>(&result,&addr_rate_limited);
              uVar21 = pNVar31->m_max_addr_rate_limited_length;
              if (pNVar31->m_max_addr_rate_limited_length < result._M_string_length) {
                uVar21 = result._M_string_length;
              }
              pNVar31->m_max_addr_rate_limited_length = uVar21;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              uVar21 = pNVar31->m_max_age_length;
              if (pNVar31->m_max_age_length < age._M_string_length) {
                uVar21 = age._M_string_length;
              }
              pNVar31->m_max_age_length = uVar21;
              this = pNVar31;
              util::ToString<int>(&result,&peer_id);
              uVar21 = pNVar31->m_max_id_length;
              if (pNVar31->m_max_id_length < result._M_string_length) {
                uVar21 = result._M_string_length;
              }
              pNVar31->m_max_id_length = uVar21;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p != &result.field_2) {
                operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
              }
              this->m_is_asmap_on = (bool)(this->m_is_asmap_on | in_stack_fffffffffffff9ec != 0);
              if ((char **)rows._M_elems[0] != rows._M_elems + 2) {
                operator_delete(rows._M_elems[0],(ulong)(rows._M_elems[2] + 1));
              }
              if ((pointer *)
                  reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(reachable_networks.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (ulong)(reachable_networks.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)age._M_dataplus._M_p != &age.field_2) {
                operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)addr._M_dataplus._M_p != &addr.field_2) {
                operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
              operator_delete(conn_type._M_dataplus._M_p,conn_type.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pUVar27 = pUVar27 + 1;
        } while (pUVar27 != pUVar29);
      }
      FormatFullVersion_abi_cxx11_();
      pNVar31 = this;
      ChainToString_abi_cxx11_(&conn_type,this);
      addr._M_dataplus._M_p = (pointer)&addr.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"protocolversion","");
      pUVar14 = UniValue::operator[](pUVar13,&addr);
      iVar12 = UniValue::getInt<int>(pUVar14);
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(reachable_networks.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,iVar12);
      age._M_dataplus._M_p = (pointer)&age.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&age,"subversion","");
      pUVar14 = UniValue::operator[](pUVar13,&age);
      pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12ebf0;
      psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
      pcVar23 = (char *)&network;
      tinyformat::
      format<char[13],std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
                (&result,(tinyformat *)"%s client %s%s - server %i%s\n\n","Bitcoin Core",
                 (char (*) [13])pcVar23,&conn_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &reachable_networks,(int *)psVar18,pbVar30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)age._M_dataplus._M_p != &age.field_2) {
        operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)addr._M_dataplus._M_p != &addr.field_2) {
        operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
        operator_delete(conn_type._M_dataplus._M_p,conn_type.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)network._M_dataplus._M_p != &network.field_2) {
        operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
      }
      if ((byte)(this->m_details_level - 1) < 4) {
        pPVar25 = (this->m_peers).
                  super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar6 = (this->m_peers).
                 super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pPVar25 != pPVar6) {
          uVar21 = ((long)pPVar6 - (long)pPVar25 >> 3) * -0x5075075075075075;
          lVar15 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<NetinfoRequestHandler::Peer*,std::vector<NetinfoRequestHandler::Peer,std::allocator<NetinfoRequestHandler::Peer>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pPVar25,pPVar6,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<NetinfoRequestHandler::Peer*,std::vector<NetinfoRequestHandler::Peer,std::allocator<NetinfoRequestHandler::Peer>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pPVar25,pPVar6);
          psVar1 = &this->m_max_addr_processed_length;
          in_stack_fffffffffffffa18 = (pointer)&this->m_max_addr_rate_limited_length;
          pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &this->m_max_age_length;
          in_stack_fffffffffffffa00 = SUB81(psVar1,0);
          in_stack_fffffffffffffa01 = (undefined7)((ulong)psVar1 >> 8);
          tinyformat::format<unsigned_long,char[6],unsigned_long,char[6],unsigned_long,char[4]>
                    (&network,(tinyformat *)
                              "<->   type   net  v  mping   ping send recv  txn  blk  hb %*s%*s%*s "
                     ,(char *)psVar1,(unsigned_long *)"addrp",
                     (char (*) [6])in_stack_fffffffffffffa18,(unsigned_long *)"addrl",
                     (char (*) [6])pbVar30,(unsigned_long *)0x1accd1,
                     (char (*) [4])in_stack_fffffffffffff9c8);
          args_4 = (char **)0x12ed79;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            args_4 = (char **)0x12ed9e;
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          if (this->m_is_asmap_on == true) {
            args_4 = (char **)0x12edb8;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result," asmap ");
          }
          psVar1 = &this->m_max_id_length;
          bVar9 = (this->m_details_level - 2 & 0xfd) == 0;
          conn_type._M_dataplus._M_p = (pointer)0x0;
          if (bVar9) {
            conn_type._M_dataplus._M_p = (pointer)this->m_max_addr_length;
          }
          psVar18 = &conn_type;
          addr._M_dataplus._M_p = "address";
          if (!bVar9) {
            addr._M_dataplus._M_p = "";
          }
          age._M_dataplus._M_p = "version";
          if (1 < (byte)(this->m_details_level - 3)) {
            age._M_dataplus._M_p = "";
          }
          in_stack_fffffffffffffa10 = SUB81(psVar1,0);
          in_stack_fffffffffffffa11 = (undefined7)((ulong)psVar1 >> 8);
          tinyformat::format<unsigned_long,char[3],unsigned_long,char_const*,char_const*>
                    (&network,(tinyformat *)0x1abb83,(char *)psVar1,(unsigned_long *)0x1ac9cd,
                     (char (*) [3])psVar18,(unsigned_long *)&addr,(char **)&age,args_4);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pPVar25 = (this->m_peers).
                    super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (this->m_peers).
                   super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pPVar25 != pPVar6) {
            do {
              util::ToString<int>(&conn_type,&pPVar25->version);
              pbVar20 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&conn_type,(pPVar25->sub_version)._M_dataplus._M_p,
                                   (pPVar25->sub_version)._M_string_length);
              network._M_dataplus._M_p = (pointer)&network.field_2;
              pcVar5 = (pbVar20->_M_dataplus)._M_p;
              paVar22 = &pbVar20->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar5 == paVar22) {
                network.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
                network.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
              }
              else {
                network.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
                network._M_dataplus._M_p = pcVar5;
              }
              network._M_string_length = pbVar20->_M_string_length;
              (pbVar20->_M_dataplus)._M_p = (pointer)paVar22;
              pbVar20->_M_string_length = 0;
              (pbVar20->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
                operator_delete(conn_type._M_dataplus._M_p,
                                conn_type.field_2._M_allocated_capacity + 1);
              }
              local_561._1_8_ = "connections_in";
              if (pPVar25->is_outbound != false) {
                local_561._1_8_ = "connections_out";
              }
              local_561._1_8_ = local_561._1_8_ + 0xc;
              ConnectionTypeForNetinfo(&addr,this,&pPVar25->conn_type);
              local_561[0] = ' ';
              if (((pPVar25->transport_protocol_type)._M_string_length == 2) &&
                 (pcVar23 = (pPVar25->transport_protocol_type)._M_dataplus._M_p, *pcVar23 == 'v')) {
                local_561[0] = pcVar23[1];
              }
              PingTimeToString_abi_cxx11_(&age,this,pPVar25->min_ping);
              PingTimeToString_abi_cxx11_((string *)&reachable_networks,this,pPVar25->ping);
              if (pPVar25->last_send == 0) {
                rows._M_elems[0] = (char *)(rows._M_elems + 2);
                std::__cxx11::string::_M_construct<char_const*>((string *)&rows,"","");
              }
              else {
                local_570 = lVar17 - pPVar25->last_send;
                util::ToString<long>((string *)&rows,&local_570);
              }
              if (pPVar25->last_recv == 0) {
                addr_processed = (int64_t)&local_320;
                std::__cxx11::string::_M_construct<char_const*>((string *)&addr_processed,"","");
              }
              else {
                local_578 = lVar17 - pPVar25->last_recv;
                util::ToString<long>((string *)&addr_processed,&local_578);
              }
              if (pPVar25->last_trxn == 0) {
                pcVar23 = "*";
                if ((ulong)pPVar25->is_tx_relay != 0) {
                  pcVar23 = "";
                }
                addr_rate_limited = (int64_t)&local_340;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&addr_rate_limited,pcVar23,
                           pcVar23 + ((ulong)pPVar25->is_tx_relay ^ 1));
              }
              else {
                local_580 = (lVar17 - pPVar25->last_trxn) / 0x3c;
                util::ToString<long>((string *)&addr_rate_limited,&local_580);
              }
              if (pPVar25->last_blck == 0) {
                _peer_id = (pointer)&local_360;
                std::__cxx11::string::_M_construct<char_const*>((string *)&peer_id,"","");
              }
              else {
                local_588 = (lVar17 - pPVar25->last_blck) / 0x3c;
                util::ToString<long>((string *)&peer_id,&local_588);
              }
              args = (char (*) [2])0x1bf184;
              pcVar23 = " ";
              if (pPVar25->is_bip152_hb_to != false) {
                pcVar23 = ".";
              }
              if (pPVar25->is_bip152_hb_from != false) {
                args = (char (*) [2])0x1adfa7;
              }
              tinyformat::format<char[2],char[2]>
                        (&local_390,(tinyformat *)"%s%s",pcVar23,args,(char (*) [2])psVar18);
              if (pPVar25->addr_processed == 0) {
                pcVar23 = ".";
                if ((ulong)pPVar25->is_addr_relay_enabled != 0) {
                  pcVar23 = "";
                }
                local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3b0,pcVar23,
                           pcVar23 + ((ulong)pPVar25->is_addr_relay_enabled ^ 1));
              }
              else {
                util::ToString<long>(&local_3b0,&pPVar25->addr_processed);
              }
              if (pPVar25->addr_rate_limited == 0) {
                local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"","");
              }
              else {
                util::ToString<long>(&local_3d0,&pPVar25->addr_rate_limited);
              }
              in_stack_fffffffffffffa74 = 0;
              if (this->m_is_asmap_on != false) {
                in_stack_fffffffffffffa74 = 7;
              }
              if ((this->m_is_asmap_on == true) && (pPVar25->mapped_as != 0)) {
                util::ToString<int>(&local_3f0,&pPVar25->mapped_as);
              }
              else {
                local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"","");
              }
              bVar24 = this->m_details_level;
              if ((bVar24 - 2 & 0xfffffffd) == 0) {
                in_stack_fffffffffffffa68 = this->m_max_addr_length;
              }
              else {
                in_stack_fffffffffffffa68 = 0;
              }
              if ((bVar24 == 4) || (bVar24 == 2)) {
                local_410[0] = local_400;
                pcVar5 = (pPVar25->addr)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_410,pcVar5,pcVar5 + (pPVar25->addr)._M_string_length);
              }
              else {
                local_410[0] = local_400;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"","");
              }
              if (((byte)(this->m_details_level - 3) < 2) &&
                 (iVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&network,"0"), iVar12 != 0)) {
                local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_430,network._M_dataplus._M_p,
                           network._M_dataplus._M_p + network._M_string_length);
              }
              else {
                local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"","");
              }
              psVar18 = &pPVar25->network;
              tinyformat::
              format<char_const*,std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,std::__cxx11::string,int,std::__cxx11::string,unsigned_long,int,unsigned_long,std::__cxx11::string,std::__cxx11::string>
                        (&conn_type,
                         (tinyformat *)
                         "%3s %6s %5s %2s%7s%7s%5s%5s%5s%5s  %2s %*s%*s%*s%*i %*s %-*s%s\n",
                         local_561 + 1,(char **)&addr,psVar18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_561,(char *)&age,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &reachable_networks,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rows,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &addr_processed,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &addr_rate_limited,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &peer_id,&local_390,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(in_stack_fffffffffffffa01,in_stack_fffffffffffffa00),
                         (unsigned_long *)&local_3b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa18,(unsigned_long *)&local_3d0,pbVar30,
                         (unsigned_long *)&pPVar25->age,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffa74,(int *)&local_3f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(in_stack_fffffffffffffa11,in_stack_fffffffffffffa10),
                         (unsigned_long *)&pPVar25->id,(int *)&stack0xfffffffffffffa68,
                         (unsigned_long *)local_410,&local_430,in_stack_fffffffffffff9c8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&result,conn_type._M_dataplus._M_p,conn_type._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
                operator_delete(conn_type._M_dataplus._M_p,
                                conn_type.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_430._M_dataplus._M_p != &local_430.field_2) {
                operator_delete(local_430._M_dataplus._M_p,
                                local_430.field_2._M_allocated_capacity + 1);
              }
              if (local_410[0] != local_400) {
                operator_delete(local_410[0],local_400[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                operator_delete(local_3f0._M_dataplus._M_p,
                                local_3f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p,
                                local_3d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != &local_390.field_2) {
                operator_delete(local_390._M_dataplus._M_p,
                                local_390.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_peer_id != &local_360) {
                operator_delete(_peer_id,local_360._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)addr_rate_limited != &local_340) {
                operator_delete((void *)addr_rate_limited,local_340._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)addr_processed != &local_320) {
                operator_delete((void *)addr_processed,local_320._M_allocated_capacity + 1);
              }
              if ((char **)rows._M_elems[0] != rows._M_elems + 2) {
                operator_delete(rows._M_elems[0],(ulong)(rows._M_elems[2] + 1));
              }
              if ((pointer *)
                  reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(reachable_networks.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (ulong)(reachable_networks.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)age._M_dataplus._M_p != &age.field_2) {
                operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)addr._M_dataplus._M_p != &addr.field_2) {
                operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)network._M_dataplus._M_p != &network.field_2) {
                operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
              }
              pPVar25 = pPVar25 + 1;
            } while (pPVar25 != pPVar6);
          }
          pcVar23 = "min";
          tinyformat::format<unsigned_long,char[4]>
                    (&network,(tinyformat *)
                              "                        ms     ms  sec  sec  min  min                %*s\n\n"
                     ,(char *)pbVar30,(unsigned_long *)"min",(char (*) [4])psVar18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,"     ");
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      network._M_dataplus._M_p = (pointer)&network.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&network,"networks","");
      pUVar14 = UniValue::operator[](pUVar13,&network);
      pvVar16 = UniValue::getValues(pUVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)network._M_dataplus._M_p != &network.field_2) {
        operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
      }
      pUVar27 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar29 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pUVar27 != pUVar29) {
        pUVar33 = pUVar29;
        do {
          network._M_dataplus._M_p = (pointer)&network.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&network,"reachable","");
          pUVar14 = UniValue::operator[](pUVar27,&network);
          bVar9 = UniValue::get_bool(pUVar14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          if (bVar9) {
            network._M_dataplus._M_p = (pointer)&network.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&network,"name","");
            pUVar14 = UniValue::operator[](pUVar27,&network);
            psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
            this = pNVar31;
            pUVar29 = pUVar33;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)network._M_dataplus._M_p != &network.field_2) {
              operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
              this = pNVar31;
              pUVar29 = pUVar33;
            }
            paVar28 = &NETWORKS;
            lVar17 = 0;
            do {
              iVar12 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (psVar18,paVar28->_M_elems[0]);
              if (iVar12 == 0) goto LAB_0012f8c2;
              lVar17 = lVar17 + 1;
              paVar28 = (array<const_char_*,_7UL> *)((long)paVar28 + 8);
            } while (lVar17 != 7);
            lVar17 = 0xff;
LAB_0012f8c2:
            conn_type._M_dataplus._M_p._0_1_ = (char)lVar17;
            pNVar31 = this;
            pUVar33 = pUVar29;
            if ((char)lVar17 != -1) {
              tinyformat::format<std::__cxx11::string>
                        (&network,(tinyformat *)"%8s",(char *)psVar18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pcVar23);
              pNVar31 = this;
              pUVar33 = pUVar29;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&result,network._M_dataplus._M_p,network._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)network._M_dataplus._M_p != &network.field_2) {
                operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
              }
              if (reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<signed_char,std::allocator<signed_char>>::
                _M_realloc_insert<signed_char_const&>
                          ((vector<signed_char,std::allocator<signed_char>> *)&reachable_networks,
                           (iterator)
                           reachable_networks.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish,(char *)&conn_type);
              }
              else {
                *reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish = (char)conn_type._M_dataplus._M_p;
                reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     reachable_networks.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          pUVar27 = pUVar27 + 1;
        } while (pUVar27 != pUVar29);
      }
      lVar17 = 0;
      do {
        iVar12 = *(int *)((long)UNREACHABLE_NETWORK_IDS._M_elems + lVar17);
        pcVar26 = (pointer)(long)iVar12;
        if ((pointer)0x7 < pcVar26) goto LAB_001301bf;
        if ((this->m_counts)._M_elems[2]._M_elems[(long)pcVar26] != 0) {
          if (iVar12 == 7) goto LAB_001301ec;
          tinyformat::format<char_const*>
                    (&network,(tinyformat *)"%8s",
                     (char *)(NETWORK_SHORT_NAMES._M_elems + (long)pcVar26),(char **)pcVar23);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          network._M_dataplus._M_p._0_1_ = (char)iVar12;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    (&reachable_networks,(char *)&network);
        }
        lVar17 = lVar17 + 4;
      } while (lVar17 != 8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,"   total   block");
      if (this->m_manual_peers_count != '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,"  manual");
      }
      args_01 = &this->m_manual_peers_count;
      rows._M_elems[2] = "total";
      rows._M_elems[0] = "in";
      rows._M_elems[1] = "out";
      pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->m_counts
      ;
      puVar32 = &this->m_block_relay_peers_count;
      lVar17 = 0;
      do {
        tinyformat::format<char_const*>
                  (&network,(tinyformat *)"\n%-5s",(char *)(rows._M_elems + lVar17),(char **)pcVar23
                  );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&result,network._M_dataplus._M_p,network._M_string_length);
        args_00 = puVar32;
        pcVar23 = (char *)pbVar30;
        pcVar7 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar8 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)network._M_dataplus._M_p != &network.field_2) {
          operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          args_00 = puVar32;
          pcVar23 = (char *)pbVar30;
          pcVar7 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar8 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pcVar26 = reachable_networks.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_finish,
            pcVar7 != reachable_networks.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_finish; pcVar7 = pcVar7 + 1) {
          uVar21 = (ulong)*pcVar7;
          if (7 < uVar21) {
            reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
            .super__Vector_impl_data._M_finish = pcVar8;
            if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_00131128;
            std::__throw_out_of_range_fmt
                      ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar21,8);
            goto LAB_001301bf;
          }
          reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar8;
          tinyformat::format<unsigned_short>
                    (&network,"%8i",
                     (unsigned_short *)
                     ((long)&((_Alloc_hider *)((long)pbVar30 + lVar17 * 0x10U))->_M_p + uVar21 * 2))
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pcVar8 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar26;
        }
        pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar23;
        reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar8;
        tinyformat::format<unsigned_short>
                  (&network,"   %5i",
                   (unsigned_short *)
                   ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pcVar23)->_M_string_length + lVar17 * 0x10 + 6));
        puVar32 = args_00;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&result,network._M_dataplus._M_p,network._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)network._M_dataplus._M_p != &network.field_2) {
          operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
        }
        if (lVar17 == 1) {
          tinyformat::format<unsigned_char>(&network,"   %5i",args_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          if (*args_01 != '\0') {
            tinyformat::format<unsigned_char>(&network,"   %5i",args_01);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&result,network._M_dataplus._M_p,network._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)network._M_dataplus._M_p != &network.field_2) {
              operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
            }
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,"\n\nLocal addresses");
      network._M_dataplus._M_p = (pointer)&network.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&network,"localaddresses","");
      pUVar14 = __return_storage_ptr__;
      this_00 = UniValue::operator[](pUVar13,&network);
      pvVar16 = UniValue::getValues(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)network._M_dataplus._M_p != &network.field_2) {
        operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
      }
      pUVar27 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar29 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pUVar27 == pUVar29) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,": n/a\n");
      }
      else {
        addr_processed = 0;
        __return_storage_ptr__ = pUVar14;
        do {
          network._M_dataplus._M_p = (pointer)&network.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&network,"address","");
          pUVar14 = UniValue::operator[](pUVar27,&network);
          psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
          uVar21 = psVar18->_M_string_length + 1;
          if (uVar21 <= (ulong)addr_processed) {
            uVar21 = addr_processed;
          }
          addr_processed = uVar21;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pUVar27 = pUVar27 + 1;
        } while (pUVar27 != pUVar29);
        pUVar27 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pUVar29 = (pvVar16->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pUVar14 = __return_storage_ptr__;
        if (pUVar27 != pUVar29) {
          do {
            conn_type._M_dataplus._M_p = (pointer)&conn_type.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&conn_type,"address","");
            pUVar14 = UniValue::operator[](pUVar27,&conn_type);
            psVar18 = UniValue::get_str_abi_cxx11_(pUVar14);
            addr._M_dataplus._M_p = (pointer)&addr.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"port","");
            pUVar14 = UniValue::operator[](pUVar27,&addr);
            iVar12 = UniValue::getInt<int>(pUVar14);
            addr_rate_limited = CONCAT44(addr_rate_limited._4_4_,iVar12);
            age._M_dataplus._M_p = (pointer)&age.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&age,"score","");
            pUVar14 = UniValue::operator[](pUVar27,&age);
            iVar12 = UniValue::getInt<int>(pUVar14);
            peer_id = iVar12;
            tinyformat::format<unsigned_long,std::__cxx11::string,int,int>
                      (&network,(tinyformat *)"\n%-*s    port %6i    score %6i",
                       (char *)&addr_processed,(unsigned_long *)psVar18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &addr_rate_limited,&peer_id,(int *)in_stack_fffffffffffff9c8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&result,network._M_dataplus._M_p,network._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)network._M_dataplus._M_p != &network.field_2) {
              operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)age._M_dataplus._M_p != &age.field_2) {
              operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)addr._M_dataplus._M_p != &addr.field_2) {
              operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
              operator_delete(conn_type._M_dataplus._M_p,conn_type.field_2._M_allocated_capacity + 1
                             );
            }
            pUVar27 = pUVar27 + 1;
            pUVar14 = __return_storage_ptr__;
          } while (pUVar27 != pUVar29);
        }
      }
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_488,&result);
      local_4e0 = NullUniValue.typ;
      local_4d8[0] = local_4c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4d8,NullUniValue.val._M_dataplus._M_p,
                 NullUniValue.val._M_dataplus._M_p + NullUniValue.val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4b8,&NullUniValue.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_4a0,&NullUniValue.values);
      network._M_dataplus._M_p._0_4_ = 1;
      UniValue::UniValue<int,_int,_true>((UniValue *)&local_540,(int *)&network);
      local_540._M_engaged = true;
      result_00.val._M_dataplus._M_p = (pointer)puVar32;
      result_00._0_8_ = in_stack_fffffffffffff9c8;
      result_00.val._M_string_length = (size_type)pbVar30;
      result_00.val.field_2._M_allocated_capacity = (size_type)args_01;
      result_00.val.field_2._8_4_ = in_stack_fffffffffffff9e8;
      result_00.val.field_2._12_4_ = in_stack_fffffffffffff9ec;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9f0;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar13;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_fffffffffffffa00;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_fffffffffffffa01;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa08;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = in_stack_fffffffffffffa10;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = in_stack_fffffffffffffa11;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa18;
      error._4_4_ = in_stack_fffffffffffffa24;
      error.typ = in_stack_fffffffffffffa20;
      error.val._M_dataplus._M_p = (pointer)pUVar14;
      error.val._M_string_length = (size_type)in_stack_fffffffffffffa30;
      error.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa38;
      error.val.field_2._8_8_ = in_stack_fffffffffffffa40;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa48;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa50;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa58;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa60;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa68;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffa70;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffa74;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.val._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_580;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._0_8_ = local_588;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.val._M_string_length = local_578;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._24_8_ = local_570;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._32_7_ = uStack_568;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._39_1_ = local_561[0];
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_561._1_8_;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _56_40_ = stack0xfffffffffffffab0;
      JSONRPCReplyObj(__return_storage_ptr__,result_00,error,id,(JSONRPCVersion)&local_488);
      if (local_540._M_engaged == true) {
        std::_Optional_payload_base<UniValue>::_M_destroy(&local_540);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4b8);
      if (local_4d8[0] != local_4c8) {
        operator_delete(local_4d8[0],local_4c8[0] + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_488.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_488.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488.val._M_dataplus._M_p != &local_488.val.field_2) {
        operator_delete(local_488.val._M_dataplus._M_p,
                        local_488.val.field_2._M_allocated_capacity + 1);
      }
      if (reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(reachable_networks.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)reachable_networks.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)reachable_networks.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      __return_storage_ptr__->typ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start[1].typ;
      (__return_storage_ptr__->val)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->val).field_2;
      pcVar5 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start[1].val._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->val,pcVar5,
                 pcVar5 + batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                          super__Vector_impl_data._M_start[1].val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->keys,
               &batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start[1].keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector
                (&__return_storage_ptr__->values,
                 &batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start[1].values);
    }
  }
  else {
    __return_storage_ptr__->typ =
         (batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start)->typ;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    pcVar5 = ((batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start)->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->val,pcVar5,
               pcVar5 + ((batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                          super__Vector_impl_data._M_start)->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->keys,
             &(batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start)->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              (&__return_storage_ptr__->values,
               &(batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start)->values);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&batch);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return __return_storage_ptr__;
  }
LAB_00131128:
  __stack_chk_fail();
LAB_001301bf:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_00131128;
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",pcVar26,8);
LAB_001301ec:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_00131128;
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",pcVar26,7);
LAB_00130219:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_00131128;
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)");
LAB_00130243:
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"-netinfo requires bitcoind server to be running v0.21.0 and up");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  goto LAB_00131128;
}

Assistant:

UniValue ProcessReply(const UniValue& batch_in) override
    {
        const std::vector<UniValue> batch{JSONRPCProcessBatchReply(batch_in)};
        if (!batch[ID_PEERINFO]["error"].isNull()) return batch[ID_PEERINFO];
        if (!batch[ID_NETWORKINFO]["error"].isNull()) return batch[ID_NETWORKINFO];

        const UniValue& networkinfo{batch[ID_NETWORKINFO]["result"]};
        if (networkinfo["version"].getInt<int>() < 209900) {
            throw std::runtime_error("-netinfo requires bitcoind server to be running v0.21.0 and up");
        }
        const int64_t time_now{TicksSinceEpoch<std::chrono::seconds>(CliClock::now())};

        // Count peer connection totals, and if DetailsRequested(), store peer data in a vector of structs.
        for (const UniValue& peer : batch[ID_PEERINFO]["result"].getValues()) {
            const std::string network{peer["network"].get_str()};
            const int8_t network_id{NetworkStringToId(network)};
            if (network_id == UNKNOWN_NETWORK) continue;
            const bool is_outbound{!peer["inbound"].get_bool()};
            const bool is_tx_relay{peer["relaytxes"].isNull() ? true : peer["relaytxes"].get_bool()};
            const std::string conn_type{peer["connection_type"].get_str()};
            ++m_counts.at(is_outbound).at(network_id);      // in/out by network
            ++m_counts.at(is_outbound).at(NETWORKS.size()); // in/out overall
            ++m_counts.at(2).at(network_id);                // total by network
            ++m_counts.at(2).at(NETWORKS.size());           // total overall
            if (conn_type == "block-relay-only") ++m_block_relay_peers_count;
            if (conn_type == "manual") ++m_manual_peers_count;
            if (DetailsRequested()) {
                // Push data for this peer to the peers vector.
                const int peer_id{peer["id"].getInt<int>()};
                const int mapped_as{peer["mapped_as"].isNull() ? 0 : peer["mapped_as"].getInt<int>()};
                const int version{peer["version"].getInt<int>()};
                const int64_t addr_processed{peer["addr_processed"].isNull() ? 0 : peer["addr_processed"].getInt<int64_t>()};
                const int64_t addr_rate_limited{peer["addr_rate_limited"].isNull() ? 0 : peer["addr_rate_limited"].getInt<int64_t>()};
                const int64_t conn_time{peer["conntime"].getInt<int64_t>()};
                const int64_t last_blck{peer["last_block"].getInt<int64_t>()};
                const int64_t last_recv{peer["lastrecv"].getInt<int64_t>()};
                const int64_t last_send{peer["lastsend"].getInt<int64_t>()};
                const int64_t last_trxn{peer["last_transaction"].getInt<int64_t>()};
                const double min_ping{peer["minping"].isNull() ? -1 : peer["minping"].get_real()};
                const double ping{peer["pingtime"].isNull() ? -1 : peer["pingtime"].get_real()};
                const std::string addr{peer["addr"].get_str()};
                const std::string age{conn_time == 0 ? "" : ToString((time_now - conn_time) / 60)};
                const std::string sub_version{peer["subver"].get_str()};
                const std::string transport{peer["transport_protocol_type"].isNull() ? "v1" : peer["transport_protocol_type"].get_str()};
                const bool is_addr_relay_enabled{peer["addr_relay_enabled"].isNull() ? false : peer["addr_relay_enabled"].get_bool()};
                const bool is_bip152_hb_from{peer["bip152_hb_from"].get_bool()};
                const bool is_bip152_hb_to{peer["bip152_hb_to"].get_bool()};
                m_peers.push_back({addr, sub_version, conn_type, NETWORK_SHORT_NAMES[network_id], age, transport, min_ping, ping, addr_processed, addr_rate_limited, last_blck, last_recv, last_send, last_trxn, peer_id, mapped_as, version, is_addr_relay_enabled, is_bip152_hb_from, is_bip152_hb_to, is_outbound, is_tx_relay});
                m_max_addr_length = std::max(addr.length() + 1, m_max_addr_length);
                m_max_addr_processed_length = std::max(ToString(addr_processed).length(), m_max_addr_processed_length);
                m_max_addr_rate_limited_length = std::max(ToString(addr_rate_limited).length(), m_max_addr_rate_limited_length);
                m_max_age_length = std::max(age.length(), m_max_age_length);
                m_max_id_length = std::max(ToString(peer_id).length(), m_max_id_length);
                m_is_asmap_on |= (mapped_as != 0);
            }
        }

        // Generate report header.
        std::string result{strprintf("%s client %s%s - server %i%s\n\n", PACKAGE_NAME, FormatFullVersion(), ChainToString(), networkinfo["protocolversion"].getInt<int>(), networkinfo["subversion"].get_str())};

        // Report detailed peer connections list sorted by direction and minimum ping time.
        if (DetailsRequested() && !m_peers.empty()) {
            std::sort(m_peers.begin(), m_peers.end());
            result += strprintf("<->   type   net  v  mping   ping send recv  txn  blk  hb %*s%*s%*s ",
                                m_max_addr_processed_length, "addrp",
                                m_max_addr_rate_limited_length, "addrl",
                                m_max_age_length, "age");
            if (m_is_asmap_on) result += " asmap ";
            result += strprintf("%*s %-*s%s\n", m_max_id_length, "id", IsAddressSelected() ? m_max_addr_length : 0, IsAddressSelected() ? "address" : "", IsVersionSelected() ? "version" : "");
            for (const Peer& peer : m_peers) {
                std::string version{ToString(peer.version) + peer.sub_version};
                result += strprintf(
                    "%3s %6s %5s %2s%7s%7s%5s%5s%5s%5s  %2s %*s%*s%*s%*i %*s %-*s%s\n",
                    peer.is_outbound ? "out" : "in",
                    ConnectionTypeForNetinfo(peer.conn_type),
                    peer.network,
                    (peer.transport_protocol_type.size() == 2 && peer.transport_protocol_type[0] == 'v') ? peer.transport_protocol_type[1] : ' ',
                    PingTimeToString(peer.min_ping),
                    PingTimeToString(peer.ping),
                    peer.last_send ? ToString(time_now - peer.last_send) : "",
                    peer.last_recv ? ToString(time_now - peer.last_recv) : "",
                    peer.last_trxn ? ToString((time_now - peer.last_trxn) / 60) : peer.is_tx_relay ? "" : "*",
                    peer.last_blck ? ToString((time_now - peer.last_blck) / 60) : "",
                    strprintf("%s%s", peer.is_bip152_hb_to ? "." : " ", peer.is_bip152_hb_from ? "*" : " "),
                    m_max_addr_processed_length, // variable spacing
                    peer.addr_processed ? ToString(peer.addr_processed) : peer.is_addr_relay_enabled ? "" : ".",
                    m_max_addr_rate_limited_length, // variable spacing
                    peer.addr_rate_limited ? ToString(peer.addr_rate_limited) : "",
                    m_max_age_length, // variable spacing
                    peer.age,
                    m_is_asmap_on ? 7 : 0, // variable spacing
                    m_is_asmap_on && peer.mapped_as ? ToString(peer.mapped_as) : "",
                    m_max_id_length, // variable spacing
                    peer.id,
                    IsAddressSelected() ? m_max_addr_length : 0, // variable spacing
                    IsAddressSelected() ? peer.addr : "",
                    IsVersionSelected() && version != "0" ? version : "");
            }
            result += strprintf("                        ms     ms  sec  sec  min  min                %*s\n\n", m_max_age_length, "min");
        }

        // Report peer connection totals by type.
        result += "     ";
        std::vector<int8_t> reachable_networks;
        for (const UniValue& network : networkinfo["networks"].getValues()) {
            if (network["reachable"].get_bool()) {
                const std::string& network_name{network["name"].get_str()};
                const int8_t network_id{NetworkStringToId(network_name)};
                if (network_id == UNKNOWN_NETWORK) continue;
                result += strprintf("%8s", network_name); // column header
                reachable_networks.push_back(network_id);
            }
        };

        for (const size_t network_id : UNREACHABLE_NETWORK_IDS) {
            if (m_counts.at(2).at(network_id) == 0) continue;
            result += strprintf("%8s", NETWORK_SHORT_NAMES.at(network_id)); // column header
            reachable_networks.push_back(network_id);
        }

        result += "   total   block";
        if (m_manual_peers_count) result += "  manual";

        const std::array rows{"in", "out", "total"};
        for (size_t i = 0; i < rows.size(); ++i) {
            result += strprintf("\n%-5s", rows[i]); // row header
            for (int8_t n : reachable_networks) {
                result += strprintf("%8i", m_counts.at(i).at(n)); // network peers count
            }
            result += strprintf("   %5i", m_counts.at(i).at(NETWORKS.size())); // total peers count
            if (i == 1) { // the outbound row has two extra columns for block relay and manual peer counts
                result += strprintf("   %5i", m_block_relay_peers_count);
                if (m_manual_peers_count) result += strprintf("   %5i", m_manual_peers_count);
            }
        }

        // Report local addresses, ports, and scores.
        result += "\n\nLocal addresses";
        const std::vector<UniValue>& local_addrs{networkinfo["localaddresses"].getValues()};
        if (local_addrs.empty()) {
            result += ": n/a\n";
        } else {
            size_t max_addr_size{0};
            for (const UniValue& addr : local_addrs) {
                max_addr_size = std::max(addr["address"].get_str().length() + 1, max_addr_size);
            }
            for (const UniValue& addr : local_addrs) {
                result += strprintf("\n%-*s    port %6i    score %6i", max_addr_size, addr["address"].get_str(), addr["port"].getInt<int>(), addr["score"].getInt<int>());
            }
        }

        return JSONRPCReplyObj(UniValue{result}, NullUniValue, /*id=*/1, JSONRPCVersion::V2);
    }